

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_calculator.cpp
# Opt level: O3

bool __thiscall ON_ArithmeticCalculator::Evaluate(ON_ArithmeticCalculator *this,double *value)

{
  bool bVar1;
  double z;
  double local_10;
  
  local_10 = -1.23432101234321e+308;
  if (this->m_pCalc == (ON_ArithmeticCalculatorImplementation *)0x0) {
    bVar1 = false;
  }
  else {
    bVar1 = ON_ArithmeticCalculatorImplementation::Evaluate(this->m_pCalc,&local_10);
  }
  if (value != (double *)0x0) {
    *value = local_10;
  }
  return bVar1;
}

Assistant:

bool ON_ArithmeticCalculator::Evaluate(double* value)
{
  double z = ON_UNSET_VALUE;
  bool rc = m_pCalc ? m_pCalc->Evaluate(&z) : false;
  if ( value )
    *value = z;
  return rc;
}